

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckDistinctCount(Configuration *state,string *sql_statement,bool *print_statement)

{
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(\bdistinct\b)",0x10);
  std::__cxx11::string::string
            ((string *)&title,"Eliminate Unnecessary DISTINCT Conditions",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&title);
  std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a9a2d,&local_a9);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_48,&local_68,true,5);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&title);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckDistinctCount(Configuration& state,
                        const std::string& sql_statement,
                        bool& print_statement){

  std::regex pattern("(\bdistinct\b)");
  std::string title = "Eliminate Unnecessary DISTINCT Conditions";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;
  std::size_t min_count = 5;

  auto message =
      "● Eliminate Unnecessary DISTINCT Conditions:  "
      "Too many DISTINCT conditions is a symptom of complex spaghetti queries. "
      "Consider splitting up the complex query into many simpler queries, "
      "and reduce the number of DISTINCT conditions "
      "It is possible that the DISTINCT condition has no effect if a primary key "
      "column is part of the result set of columns";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true,
               min_count);

}